

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O1

DHUDMessage * __thiscall DBaseStatusBar::DetachMessage(DBaseStatusBar *this,DHUDMessage *msg)

{
  DHUDMessage *in_RAX;
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 aVar1;
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 *paVar2;
  DHUDMessage *pDVar3;
  DHUDMessage *pDVar4;
  long lVar5;
  bool bVar6;
  
  lVar5 = 0;
  while( true ) {
    paVar2 = &this->Messages[lVar5].field_0;
    pDVar3 = paVar2->p;
    if ((pDVar3 != (DHUDMessage *)0x0) && (((pDVar3->super_DObject).ObjectFlags & 0x20) != 0)) {
      paVar2->p = (DHUDMessage *)0x0;
      pDVar3 = (DHUDMessage *)0x0;
    }
    bVar6 = pDVar3 != (DHUDMessage *)0x0;
    pDVar4 = pDVar3;
    if (pDVar3 != msg && bVar6) {
      do {
        pDVar3 = (pDVar4->Next).field_0.p;
        paVar2 = &(pDVar4->Next).field_0;
        if ((pDVar3 != (DHUDMessage *)0x0) && (((pDVar3->super_DObject).ObjectFlags & 0x20) != 0)) {
          (((TObjPtr<DHUDMessage> *)paVar2)->field_0).p = (DHUDMessage *)0x0;
          pDVar3 = (DHUDMessage *)0x0;
        }
        bVar6 = pDVar3 != (DHUDMessage *)0x0;
      } while ((bVar6) && (pDVar4 = pDVar3, pDVar3 != msg));
    }
    if (bVar6) {
      aVar1 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)(pDVar3->Next).field_0.p;
      if ((aVar1.p != (DHUDMessage *)0x0) && ((((aVar1.p)->super_DObject).ObjectFlags & 0x20) != 0))
      {
        (pDVar3->Next).field_0.p = (DHUDMessage *)0x0;
        aVar1.p = (DHUDMessage *)0x0;
      }
      paVar2->p = (DHUDMessage *)aVar1;
      (pDVar3->Next).field_0.p = (DHUDMessage *)0x0;
      in_RAX = pDVar3;
      if (screen != (DFrameBuffer *)0x0) {
        if (StatusBar == (DBaseStatusBar *)0x0) {
          SB_state = 0;
        }
        else {
          SB_state = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20]
                     )();
        }
      }
    }
    if (bVar6) break;
    lVar5 = lVar5 + 1;
    if (lVar5 == 3) {
      return (DHUDMessage *)0x0;
    }
  }
  return in_RAX;
}

Assistant:

DHUDMessage *DBaseStatusBar::DetachMessage (DHUDMessage *msg)
{
	for (size_t i = 0; i < countof(Messages); ++i)
	{
		DHUDMessage *probe = Messages[i];
		DHUDMessage **prev = &Messages[i];

		while (probe && probe != msg)
		{
			prev = &probe->Next;
			probe = probe->Next;
		}
		if (probe != NULL)
		{
			*prev = probe->Next;
			probe->Next = NULL;
			// Redraw the status bar in case it was covered
			if (screen != NULL)
			{
				ST_SetNeedRefresh();
			}
			return probe;
		}
	}
	return NULL;
}